

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,double *variable,string *value)

{
  char *__nptr;
  double *in_RSI;
  double dVar1;
  char *res;
  char *local_20 [2];
  double *local_10;
  
  local_20[0] = (char *)0x0;
  local_10 = in_RSI;
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = strtod(__nptr,local_20);
  *local_10 = dVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(double* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  *variable = strtod(value.c_str(), &res);
  // if ( res && *res )
  //  {
  //  Can handle non-double
  //  }
}